

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamping.c
# Opt level: O3

void push_complete_tx_timestamp(pending_tx_timestamps *tx_timestamps,timespec *to_add)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  timestamp_info *ptVar4;
  __syscall_slong_t _Var5;
  uint uVar6;
  
  ptVar4 = tx_timestamps->pending;
  uVar3 = tx_timestamps->tail;
  uVar6 = get_max_pending_reqs();
  ptVar4 = ptVar4 + (ulong)uVar3 % (ulong)uVar6;
  _Var5 = to_add->tv_nsec;
  (ptVar4->time).tv_sec = to_add->tv_sec;
  (ptVar4->time).tv_nsec = _Var5;
  uVar1 = tx_timestamps->head;
  uVar2 = tx_timestamps->tail;
  tx_timestamps->head = uVar1 + 1;
  tx_timestamps->tail = uVar2 + 1;
  add_tx_timestamp(&ptVar4->time);
  return;
}

Assistant:

void push_complete_tx_timestamp(struct pending_tx_timestamps *tx_timestamps,
								struct timespec *to_add)
{
	struct timestamp_info *ts_info;

	ts_info =
		&tx_timestamps->pending[tx_timestamps->tail % get_max_pending_reqs()];
	ts_info->time = *to_add;
	// this is confusing but the consumed is used when receiving the reply
	tx_timestamps->head++;
	tx_timestamps->tail++;
	add_tx_timestamp(&ts_info->time);
}